

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

ares_bool_t ares_timedout(ares_timeval_t *now,ares_timeval_t *check)

{
  long lVar1;
  ares_int64_t secs;
  ares_timeval_t *check_local;
  ares_timeval_t *now_local;
  
  lVar1 = now->sec - check->sec;
  if (lVar1 < 1) {
    if (lVar1 < 0) {
      now_local._4_4_ = ARES_FALSE;
    }
    else {
      now_local._4_4_ = (ares_bool_t)(-1 < (long)((ulong)now->usec - (ulong)check->usec));
    }
  }
  else {
    now_local._4_4_ = ARES_TRUE;
  }
  return now_local._4_4_;
}

Assistant:

ares_bool_t ares_timedout(const ares_timeval_t *now,
                          const ares_timeval_t *check)
{
  ares_int64_t secs = (now->sec - check->sec);

  if (secs > 0) {
    return ARES_TRUE; /* yes, timed out */
  }
  if (secs < 0) {
    return ARES_FALSE; /* nope, not timed out */
  }

  /* if the full seconds were identical, check the sub second parts */
  return ((ares_int64_t)now->usec - (ares_int64_t)check->usec) >= 0
           ? ARES_TRUE
           : ARES_FALSE;
}